

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack3_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 7) + base;
  out[1] = (*in >> 3 & 7) + base;
  out[2] = (*in >> 6 & 7) + base;
  out[3] = (*in >> 9 & 7) + base;
  out[4] = (*in >> 0xc & 7) + base;
  out[5] = (*in >> 0xf & 7) + base;
  out[6] = (*in >> 0x12 & 7) + base;
  out[7] = (*in >> 0x15 & 7) + base;
  out[8] = (*(byte *)((long)in + 3) & 7) + base;
  out[9] = (*in >> 0x1b & 7) + base;
  uVar1 = *in;
  out[10] = uVar1 >> 0x1e;
  out[10] = (uVar1 >> 0x1e) + base + (in[1] & 1) * 4;
  out[0xb] = (in[1] >> 1 & 7) + base;
  out[0xc] = (in[1] >> 4 & 7) + base;
  out[0xd] = (in[1] >> 7 & 7) + base;
  out[0xe] = (in[1] >> 10 & 7) + base;
  out[0xf] = (in[1] >> 0xd & 7) + base;
  return in + 2;
}

Assistant:

uint32_t * unpack3_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 3 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 3 )  ;
    *out += base;
    out++;

    return in + 1;
}